

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeBuiltinVarInstance *this)

{
  DataType DVar1;
  int iVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar5;
  VkDescriptorPool descriptorPool_00;
  deUint64 dVar6;
  VkQueue queue;
  ComputeBuiltinVarCase *pCVar7;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)16>_> data_01;
  RefData<vk::Handle<(vk::HandleType)18>_> data_02;
  RefData<vk::Handle<(vk::HandleType)21>_> data_03;
  RefData<vk::Handle<(vk::HandleType)24>_> data_04;
  RefData<vk::VkCommandBuffer_s_*> data_05;
  RefData<vk::Handle<(vk::HandleType)22>_> data_06;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ostream *this_00;
  reference this_01;
  UVec3 *pUVar14;
  UVec3 *pUVar15;
  uint *puVar16;
  Allocator *pAVar17;
  Allocation *pAVar18;
  uint (*pauVar19) [2];
  VkDeviceSize VVar20;
  DescriptorSetLayoutBuilder *pDVar21;
  ProgramCollection<vk::ProgramBinary> *this_02;
  ProgramBinary *binary;
  Handle<(vk::HandleType)19> *pHVar22;
  Handle<(vk::HandleType)16> *pHVar23;
  Handle<(vk::HandleType)14> *pHVar24;
  DescriptorPoolBuilder *pDVar25;
  VkBuffer *pVVar26;
  Handle<(vk::HandleType)24> *pHVar27;
  VkCommandBuffer_s **ppVVar28;
  Handle<(vk::HandleType)18> *pHVar29;
  Handle<(vk::HandleType)21> *pHVar30;
  Handle<(vk::HandleType)22> *pHVar31;
  DescriptorSetUpdateBuilder *pDVar32;
  VkDeviceMemory memory;
  void *pvVar33;
  TestContext *this_03;
  TestLog *pTVar34;
  MessageBuilder *pMVar35;
  size_type sVar36;
  allocator<char> local_cf1;
  string local_cf0;
  undefined4 local_cd0;
  allocator<char> local_cc9;
  string local_cc8;
  uint local_ca4;
  MessageBuilder local_ca0;
  MessageBuilder local_b20;
  LogComps local_9a0;
  LogComps local_990;
  MessageBuilder local_980;
  undefined1 local_7fc [8];
  UVec3 resValue;
  deUint32 *resPtr;
  UVec3 refValue;
  deUint32 refOffset;
  undefined1 local_7cc [8];
  UVec3 refGlobalID;
  UVec3 refLocalID;
  UVec3 refGroupID;
  deUint32 localX;
  deUint32 localY;
  deUint32 localZ;
  deUint32 groupX;
  deUint32 groupY;
  deUint32 groupZ;
  TestContext *testCtx;
  int maxLogPrints;
  int numFailed;
  deUint8 *ptr;
  Allocation *resultAlloc;
  Location local_760;
  VkDescriptorSet local_758;
  Location local_750;
  VkDescriptorSet local_748;
  DescriptorSetUpdateBuilder local_740;
  deUint64 local_6f8;
  undefined1 local_6f0 [8];
  VkDescriptorBufferInfo uniformDescriptorInfo;
  undefined1 local_6d0 [8];
  VkDescriptorBufferInfo resultDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_6a8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_688;
  undefined1 local_668 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::VkCommandBuffer_s_*> local_638;
  RefData<vk::VkCommandBuffer_s_*> local_618;
  undefined1 local_5f8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_5b8;
  undefined1 local_598 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_570 [8];
  VkBufferMemoryBarrier bufferBarrier;
  Move<vk::Handle<(vk::HandleType)21>_> local_520;
  RefData<vk::Handle<(vk::HandleType)21>_> local_500;
  undefined1 local_4e0 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_4b0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_490;
  undefined1 local_470 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_448;
  RefData<vk::Handle<(vk::HandleType)16>_> local_428;
  undefined1 local_408 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)14>_> local_3c8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_3a8;
  undefined1 local_388 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Move<vk::Handle<(vk::HandleType)19>_> local_320;
  RefData<vk::Handle<(vk::HandleType)19>_> local_300;
  undefined1 local_2e0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Allocation *alloc;
  VkBufferCreateInfo local_2a8;
  undefined1 local_270 [8];
  Buffer resultBuffer;
  VkBufferCreateInfo local_238;
  undefined1 local_200 [8];
  Buffer uniformBuffer;
  deUint32 resultBufferSize;
  deUint32 resultBufferStride;
  deUint32 numInvocations;
  int numScalars;
  deUint32 sizeOfUniformBuffer;
  UVec2 stride;
  UVec3 globalSize;
  SubCase *subCase;
  ostringstream local_190 [8];
  ostringstream program_name;
  ComputeBuiltinVarInstance *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = std::operator<<((ostream *)local_190,
                            (string *)compute::(anonymous_namespace)::s_prefixProgramName_abi_cxx11_
                           );
  std::ostream::operator<<(this_00,this->m_subCaseNdx);
  this_01 = std::
            vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
            ::operator[](&this->m_subCases,(long)this->m_subCaseNdx);
  pUVar14 = SubCase::localSize(this_01);
  pUVar15 = SubCase::numWorkGroups(this_01);
  tcu::operator*((tcu *)&stride,pUVar14,pUVar15);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)&stride,0);
  uVar9 = *puVar16;
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)&stride,1);
  uVar10 = *puVar16;
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)&stride,0);
  tcu::Vector<unsigned_int,_2>::Vector
            ((Vector<unsigned_int,_2> *)&numScalars,uVar9 * uVar10,*puVar16);
  numInvocations = 8;
  resultBufferStride = glu::getDataTypeScalarSize(this->m_varType);
  pUVar14 = SubCase::localSize(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,0);
  uVar9 = *puVar16;
  pUVar14 = SubCase::localSize(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,1);
  uVar10 = *puVar16;
  pUVar14 = SubCase::localSize(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,2);
  uVar11 = *puVar16;
  pUVar14 = SubCase::numWorkGroups(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,0);
  uVar12 = *puVar16;
  pUVar14 = SubCase::numWorkGroups(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,1);
  uVar13 = *puVar16;
  pUVar14 = SubCase::numWorkGroups(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,2);
  resultBufferSize = uVar9 * uVar10 * uVar11 * uVar12 * uVar13 * *puVar16;
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
  _4_4_ = 0;
  DVar1 = this->m_varType;
  if (DVar1 == TYPE_UINT) {
    uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
    _4_4_ = 4;
  }
  else if (DVar1 == TYPE_UINT_VEC2) {
    uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
    _4_4_ = 8;
  }
  else if (DVar1 - TYPE_UINT_VEC3 < 2) {
    uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
    _4_4_ = 0x10;
  }
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
  _0_4_ = resultBufferSize *
          uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
          m_allocator._4_4_;
  pDVar3 = this->m_vki;
  pVVar4 = this->m_device;
  pAVar17 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo(&local_238,8,0x10);
  resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_200,pDVar3,pVVar4,pAVar17,&local_238,
             ::vk::MemoryRequirement::HostVisible);
  pDVar3 = this->m_vki;
  pVVar4 = this->m_device;
  pAVar17 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo
            (&local_2a8,
             (ulong)(uint)uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.deleter.m_allocator,0x20);
  compute::Buffer::Buffer
            ((Buffer *)local_270,pDVar3,pVVar4,pAVar17,&local_2a8,
             ::vk::MemoryRequirement::HostVisible);
  pAVar18 = compute::Buffer::getAllocation((Buffer *)local_200);
  pauVar19 = (uint (*) [2])::vk::Allocation::getHostPtr(pAVar18);
  *pauVar19 = _numScalars;
  pVVar4 = this->m_device;
  pDVar3 = this->m_vki;
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar18);
  VVar20 = ::vk::Allocation::getOffset(pAVar18);
  ::vk::flushMappedMemoryRange
            (pDVar3,pVVar4,
             (VkDeviceMemory)
             descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
             m_allocator,VVar20,8);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
            );
  pDVar21 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x20);
  pDVar21 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar21,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_320,pDVar21,this->m_vki,this->m_device,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_300,(Move *)&local_320);
  data.deleter.m_deviceIface._0_4_ = (int)local_300.deleter.m_deviceIface;
  data.object.m_internal = local_300.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_300.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_300.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_300.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_300.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2e0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_320);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
            );
  pDVar3 = this->m_vki;
  pVVar4 = this->m_device;
  this_02 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::__cxx11::ostringstream::str();
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (this_02,(string *)
                              &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                               deleter.m_allocator);
  ::vk::createShaderModule(&local_3c8,pDVar3,pVVar4,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3a8,(Move *)&local_3c8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_3a8.deleter.m_deviceIface;
  data_00.object.m_internal = local_3a8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3a8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_3a8.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_3a8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_3a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_388,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_3c8);
  std::__cxx11::string::~string
            ((string *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  pVVar4 = this->m_device;
  pDVar3 = this->m_vki;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2e0);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar22->m_internal;
  makePipelineLayout(&local_448,pDVar3,pVVar4,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_428,(Move *)&local_448);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_428.deleter.m_deviceIface;
  data_01.object.m_internal = local_428.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_428.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_428.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_428.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_428.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_408,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_448);
  pVVar4 = this->m_device;
  pDVar3 = this->m_vki;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_408);
  pipelineLayout_00.m_internal = pHVar23->m_internal;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_388);
  descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar24->m_internal;
  makeComputePipeline(&local_4b0,pDVar3,pVVar4,pipelineLayout_00,
                      (VkShaderModule)
                      descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_490,(Move *)&local_4b0);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_490.deleter.m_deviceIface;
  data_02.object.m_internal = local_490.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_490.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_490.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_490.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_490.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_470,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_4b0);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&bufferBarrier.size);
  pDVar25 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&bufferBarrier.size,
                       VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  pDVar25 = ::vk::DescriptorPoolBuilder::addType(pDVar25,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_520,pDVar25,this->m_vki,this->m_device,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_500,(Move *)&local_520);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_500.deleter.m_deviceIface;
  data_03.object.m_internal = local_500.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_500.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_500.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_500.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_500.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_4e0,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_520);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder((DescriptorPoolBuilder *)&bufferBarrier.size);
  pVVar26 = compute::Buffer::operator*((Buffer *)local_270);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar26->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_570,0x40,0x2000,
             (VkBuffer)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0,
             (ulong)(uint)uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.deleter.m_allocator);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                  this->m_vki,this->m_device,this->m_queueFamilyIndex);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_5b8,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_5b8.deleter.m_deviceIface;
  data_04.object.m_internal = local_5b8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5b8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_5b8.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_5b8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_5b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_598,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pVVar4 = this->m_device;
  pDVar3 = this->m_vki;
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_598);
  ::vk::allocateCommandBuffer
            (&local_638,pDVar3,pVVar4,(VkCommandPool)pHVar27->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_618,(Move *)&local_638);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_618.deleter.m_deviceIface;
  data_05.object = local_618.object;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_618.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_618.deleter.m_device;
  data_05.deleter.m_pool.m_internal._0_4_ = (int)local_618.deleter.m_pool.m_internal;
  data_05.deleter.m_pool.m_internal._4_4_ = (int)(local_618.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5f8,data_05);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_638);
  pDVar3 = this->m_vki;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5f8);
  beginCommandBuffer(pDVar3,*ppVVar28);
  pDVar3 = this->m_vki;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5f8);
  pVVar5 = *ppVVar28;
  pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_470);
  descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       pHVar29->m_internal;
  (*pDVar3->_vptr_DeviceInterface[0x4c])
            (pDVar3,pVVar5,1,
             descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
             m_internal);
  pVVar4 = this->m_device;
  pDVar3 = this->m_vki;
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_4e0);
  descriptorPool_00.m_internal = pHVar30->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2e0);
  resultDescriptorInfo.range = pHVar22->m_internal;
  makeDescriptorSet(&local_6a8,pDVar3,pVVar4,descriptorPool_00,
                    (VkDescriptorSetLayout)resultDescriptorInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_688,(Move *)&local_6a8);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_688.deleter.m_deviceIface;
  data_06.object.m_internal = local_688.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_688.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_688.deleter.m_device;
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_688.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_688.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_668,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_6a8);
  pVVar26 = compute::Buffer::operator*((Buffer *)local_270);
  uniformDescriptorInfo.range = pVVar26->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_6d0,(VkBuffer)uniformDescriptorInfo.range,0,
             (ulong)(uint)uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.deleter.m_allocator);
  pVVar26 = compute::Buffer::operator*((Buffer *)local_200);
  local_6f8 = pVVar26->m_internal;
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_6f0,(VkBuffer)local_6f8,0,8);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_740);
  pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_668);
  local_748.m_internal = pHVar31->m_internal;
  local_750 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar32 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_740,local_748,&local_750,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       (VkDescriptorBufferInfo *)local_6f0);
  pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_668);
  local_758.m_internal = pHVar31->m_internal;
  local_760 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar32 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar32,local_758,&local_760,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_6d0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar32,this->m_vki,this->m_device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_740);
  pDVar3 = this->m_vki;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5f8);
  pVVar5 = *ppVVar28;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_408);
  dVar6 = pHVar23->m_internal;
  pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_668);
  (*pDVar3->_vptr_DeviceInterface[0x56])(pDVar3,pVVar5,1,dVar6,0,1,pHVar31,0,0);
  pDVar3 = this->m_vki;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5f8);
  pVVar5 = *ppVVar28;
  pUVar14 = SubCase::numWorkGroups(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,0);
  uVar9 = *puVar16;
  pUVar14 = SubCase::numWorkGroups(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,1);
  uVar10 = *puVar16;
  pUVar14 = SubCase::numWorkGroups(this_01);
  puVar16 = tcu::Vector<unsigned_int,_3>::operator[](pUVar14,2);
  (*pDVar3->_vptr_DeviceInterface[0x5d])(pDVar3,pVVar5,(ulong)uVar9,(ulong)uVar10,(ulong)*puVar16);
  pDVar3 = this->m_vki;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5f8);
  (*pDVar3->_vptr_DeviceInterface[0x6d])(pDVar3,*ppVVar28,0x800,0x4000,0,0,0,1,local_570,0,0);
  pDVar3 = this->m_vki;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5f8);
  endCommandBuffer(pDVar3,*ppVVar28);
  pVVar4 = this->m_device;
  pDVar3 = this->m_vki;
  queue = this->m_queue;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5f8);
  submitCommandsAndWait(pDVar3,pVVar4,queue,*ppVVar28);
  pAVar18 = compute::Buffer::getAllocation((Buffer *)local_270);
  pVVar4 = this->m_device;
  pDVar3 = this->m_vki;
  memory = ::vk::Allocation::getMemory(pAVar18);
  VVar20 = ::vk::Allocation::getOffset(pAVar18);
  ::vk::invalidateMappedMemoryRange
            (pDVar3,pVVar4,memory,VVar20,
             (ulong)(uint)uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.deleter.m_allocator);
  pvVar33 = ::vk::Allocation::getHostPtr(pAVar18);
  testCtx._4_4_ = 0;
  this_03 = Context::getTestContext((this->super_TestInstance).m_context);
  groupX = 0;
  while( true ) {
    pUVar14 = SubCase::numWorkGroups(this_01);
    uVar9 = tcu::Vector<unsigned_int,_3>::z(pUVar14);
    if (uVar9 <= groupX) break;
    localZ = 0;
    while( true ) {
      pUVar14 = SubCase::numWorkGroups(this_01);
      uVar9 = tcu::Vector<unsigned_int,_3>::y(pUVar14);
      if (uVar9 <= localZ) break;
      localY = 0;
      while( true ) {
        pUVar14 = SubCase::numWorkGroups(this_01);
        uVar9 = tcu::Vector<unsigned_int,_3>::x(pUVar14);
        if (uVar9 <= localY) break;
        localX = 0;
        while( true ) {
          pUVar14 = SubCase::localSize(this_01);
          uVar9 = tcu::Vector<unsigned_int,_3>::z(pUVar14);
          if (uVar9 <= localX) break;
          refGroupID.m_data[2] = 0;
          while( true ) {
            pUVar14 = SubCase::localSize(this_01);
            uVar9 = tcu::Vector<unsigned_int,_3>::y(pUVar14);
            if (uVar9 <= refGroupID.m_data[2]) break;
            refGroupID.m_data[1] = 0;
            while( true ) {
              pUVar14 = SubCase::localSize(this_01);
              uVar9 = tcu::Vector<unsigned_int,_3>::x(pUVar14);
              if (uVar9 <= refGroupID.m_data[1]) break;
              tcu::Vector<unsigned_int,_3>::Vector
                        ((Vector<unsigned_int,_3> *)(refLocalID.m_data + 1),localY,localZ,groupX);
              tcu::Vector<unsigned_int,_3>::Vector
                        ((Vector<unsigned_int,_3> *)(refGlobalID.m_data + 1),refGroupID.m_data[1],
                         refGroupID.m_data[2],localX);
              pUVar14 = SubCase::localSize(this_01);
              tcu::operator*((tcu *)(refValue.m_data + 2),
                             (Vector<unsigned_int,_3> *)(refLocalID.m_data + 1),pUVar14);
              tcu::operator+((tcu *)local_7cc,(Vector<unsigned_int,_3> *)(refValue.m_data + 2),
                             (Vector<unsigned_int,_3> *)(refGlobalID.m_data + 1));
              uVar9 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&numScalars);
              uVar10 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_7cc);
              uVar11 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&numScalars);
              uVar12 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_7cc);
              uVar13 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_7cc);
              refValue.m_data[1] = uVar9 * uVar10 + uVar11 * uVar12 + uVar13;
              pCVar7 = this->m_builtin_var_case;
              pUVar14 = SubCase::numWorkGroups(this_01);
              pUVar15 = SubCase::localSize(this_01);
              (*(pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                        (&resPtr,pCVar7,pUVar14,pUVar15,refLocalID.m_data + 1,refGlobalID.m_data + 1
                        );
              resValue.m_data._4_8_ =
                   (long)pvVar33 +
                   (ulong)(refValue.m_data[1] *
                          uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.deleter.m_allocator._4_4_);
              readResultVec((anon_unknown_0 *)local_7fc,(deUint32 *)resValue.m_data._4_8_,
                            resultBufferStride);
              bVar8 = compareNumComponents((UVec3 *)&resPtr,(UVec3 *)local_7fc,resultBufferStride);
              if (!bVar8) {
                if (testCtx._4_4_ < 10) {
                  pTVar34 = tcu::TestContext::getLog(this_03);
                  tcu::TestLog::operator<<
                            (&local_980,pTVar34,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar35 = tcu::MessageBuilder::operator<<
                                      (&local_980,
                                       (char (*) [36])"ERROR: comparison failed at offset ");
                  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,refValue.m_data + 1);
                  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [12])0x132e8f0);
                  LogComps::LogComps(&local_990,(UVec3 *)&resPtr,resultBufferStride);
                  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_990);
                  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [7])0x134ad58);
                  LogComps::LogComps(&local_9a0,(UVec3 *)local_7fc,resultBufferStride);
                  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_9a0);
                  tcu::MessageBuilder::operator<<
                            (pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_980);
                }
                else if (testCtx._4_4_ == 10) {
                  pTVar34 = tcu::TestContext::getLog(this_03);
                  tcu::TestLog::operator<<
                            (&local_b20,pTVar34,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar35 = tcu::MessageBuilder::operator<<(&local_b20,(char (*) [4])"...");
                  tcu::MessageBuilder::operator<<
                            (pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_b20);
                }
                testCtx._4_4_ = testCtx._4_4_ + 1;
              }
              refGroupID.m_data[1] = refGroupID.m_data[1] + 1;
            }
            refGroupID.m_data[2] = refGroupID.m_data[2] + 1;
          }
          localX = localX + 1;
        }
        localY = localY + 1;
      }
      localZ = localZ + 1;
    }
    groupX = groupX + 1;
  }
  pTVar34 = tcu::TestContext::getLog(this_03);
  tcu::TestLog::operator<<(&local_ca0,pTVar34,(BeginMessageToken *)&tcu::TestLog::Message);
  local_ca4 = resultBufferSize - testCtx._4_4_;
  pMVar35 = tcu::MessageBuilder::operator<<(&local_ca0,&local_ca4);
  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [4])" / ");
  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&resultBufferSize);
  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_ca0);
  if (testCtx._4_4_ < 1) {
    this->m_subCaseNdx = this->m_subCaseNdx + 1;
    iVar2 = this->m_subCaseNdx;
    sVar36 = std::
             vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
             ::size(&this->m_subCases);
    if (iVar2 < (int)sVar36) {
      tcu::TestStatus::incomplete();
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cf0,"Comparison succeeded",&local_cf1);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_cf0);
      std::__cxx11::string::~string((string *)&local_cf0);
      std::allocator<char>::~allocator(&local_cf1);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cc8,"Comparison failed",&local_cc9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_cc8);
    std::__cxx11::string::~string((string *)&local_cc8);
    std::allocator<char>::~allocator(&local_cc9);
  }
  local_cd0 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_668);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_598);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_4e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_470);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_408);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_388);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2e0);
  compute::Buffer::~Buffer((Buffer *)local_270);
  compute::Buffer::~Buffer((Buffer *)local_200);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	ComputeBuiltinVarInstance::iterate (void)
{
	std::ostringstream program_name;
	program_name << s_prefixProgramName << m_subCaseNdx;

	const SubCase&				subCase				= m_subCases[m_subCaseNdx];
	const tcu::UVec3			globalSize			= subCase.localSize()*subCase.numWorkGroups();
	const tcu::UVec2			stride				(globalSize[0] * globalSize[1], globalSize[0]);
	const deUint32				sizeOfUniformBuffer	= sizeof(stride);
	const int					numScalars			= glu::getDataTypeScalarSize(m_varType);
	const deUint32				numInvocations		= subCase.localSize()[0] * subCase.localSize()[1] * subCase.localSize()[2] * subCase.numWorkGroups()[0] * subCase.numWorkGroups()[1] * subCase.numWorkGroups()[2];

	deUint32					resultBufferStride = 0;
	switch (m_varType)
	{
		case glu::TYPE_UINT:
			resultBufferStride = sizeof(deUint32);
			break;
		case glu::TYPE_UINT_VEC2:
			resultBufferStride = sizeof(tcu::UVec2);
			break;
		case glu::TYPE_UINT_VEC3:
		case glu::TYPE_UINT_VEC4:
			resultBufferStride = sizeof(tcu::UVec4);
			break;
		default:
			DE_ASSERT("Illegal data type");
	}

	const deUint32				resultBufferSize	= numInvocations * resultBufferStride;

	// Create result buffer
	Buffer uniformBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(sizeOfUniformBuffer, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT), MemoryRequirement::HostVisible);
	Buffer resultBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(resultBufferSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = uniformBuffer.getAllocation();
		memcpy(alloc.getHostPtr(), &stride, sizeOfUniformBuffer);
		flushMappedMemoryRange(m_vki, m_device, alloc.getMemory(), alloc.getOffset(), sizeOfUniformBuffer);
	}

	// Create descriptorSetLayout
	const Unique<VkDescriptorSetLayout>	descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(m_vki, m_device));

	const Unique<VkShaderModule> shaderModule(createShaderModule(m_vki, m_device, m_context.getBinaryCollection().get(program_name.str()), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(m_vki, m_device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(m_vki, m_device, *pipelineLayout, *shaderModule));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(m_vki, m_device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const VkBufferMemoryBarrier bufferBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(m_vki, m_device, m_queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_vki, m_device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(m_vki, *cmdBuffer);

	m_vki.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

	// Create descriptor set
	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(m_vki, m_device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, 0ull, resultBufferSize);
	const VkDescriptorBufferInfo uniformDescriptorInfo = makeDescriptorBufferInfo(*uniformBuffer, 0ull, sizeOfUniformBuffer);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &uniformDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo)
		.update(m_vki, m_device);

	m_vki.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	// Dispatch indirect compute command
	m_vki.cmdDispatch(*cmdBuffer, subCase.numWorkGroups()[0], subCase.numWorkGroups()[1], subCase.numWorkGroups()[2]);

	m_vki.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
							 0, (const VkMemoryBarrier*)DE_NULL,
							 1, &bufferBarrier,
							 0, (const VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_vki, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_vki, m_device, m_queue, *cmdBuffer);

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(m_vki, m_device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSize);

	const deUint8*	 ptr = reinterpret_cast<deUint8*>(resultAlloc.getHostPtr());

	int			numFailed		= 0;
	const int	maxLogPrints	= 10;

	tcu::TestContext& testCtx	= m_context.getTestContext();

	for (deUint32 groupZ = 0; groupZ < subCase.numWorkGroups().z(); groupZ++)
	for (deUint32 groupY = 0; groupY < subCase.numWorkGroups().y(); groupY++)
	for (deUint32 groupX = 0; groupX < subCase.numWorkGroups().x(); groupX++)
	for (deUint32 localZ = 0; localZ < subCase.localSize().z(); localZ++)
	for (deUint32 localY = 0; localY < subCase.localSize().y(); localY++)
	for (deUint32 localX = 0; localX < subCase.localSize().x(); localX++)
	{
		const UVec3			refGroupID(groupX, groupY, groupZ);
		const UVec3			refLocalID(localX, localY, localZ);
		const UVec3			refGlobalID = refGroupID * subCase.localSize() + refLocalID;

		const deUint32		refOffset = stride.x()*refGlobalID.z() + stride.y()*refGlobalID.y() + refGlobalID.x();

		const UVec3			refValue = m_builtin_var_case->computeReference(subCase.numWorkGroups(), subCase.localSize(), refGroupID, refLocalID);

		const deUint32*		resPtr = (const deUint32*)(ptr + refOffset * resultBufferStride);
		const UVec3			resValue = readResultVec(resPtr, numScalars);

		if (!compareNumComponents(refValue, resValue, numScalars))
		{
			if (numFailed < maxLogPrints)
				testCtx.getLog()
				<< TestLog::Message
				<< "ERROR: comparison failed at offset " << refOffset
				<< ": expected " << LogComps(refValue, numScalars)
				<< ", got " << LogComps(resValue, numScalars)
				<< TestLog::EndMessage;
			else if (numFailed == maxLogPrints)
				testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

			numFailed += 1;
		}
	}

	testCtx.getLog() << TestLog::Message << (numInvocations - numFailed) << " / " << numInvocations << " values passed" << TestLog::EndMessage;

	if (numFailed > 0)
		return tcu::TestStatus::fail("Comparison failed");

	m_subCaseNdx += 1;
	return (m_subCaseNdx < (int)m_subCases.size()) ? tcu::TestStatus::incomplete() :tcu::TestStatus::pass("Comparison succeeded");
}